

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall
wallet::WalletBatch::WriteDescriptorLastHardenedCache
          (WalletBatch *this,CExtPubKey *xpub,uint256 *desc_id,uint32_t key_exp_index)

{
  byte bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ser_xpub;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>,_unsigned_int>
  *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  CExtPubKey *this_00;
  WalletBatch *in_stack_ffffffffffffff20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff28;
  CExtPubKey local_b1;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_b1;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffef8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff28,(size_type)in_stack_ffffffffffffff20,
             (allocator_type *)this_00);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffef8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef8);
  CExtPubKey::Encode(this_00,(uchar *)in_RDI);
  std::make_pair<std::__cxx11::string_const&,uint256_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
             (uint256 *)in_stack_fffffffffffffef8);
  std::make_pair<std::pair<std::__cxx11::string,uint256>,unsigned_int&>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>
              *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
             (uint *)in_stack_fffffffffffffef8);
  bVar1 = WriteIC<std::pair<std::pair<std::__cxx11::string,uint256>,unsigned_int>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (in_stack_ffffffffffffff20,
                     (pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>,_unsigned_int>
                      *)this_00,in_RDI,SUB81((ulong)in_RSI >> 0x38,0));
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>,_unsigned_int>
  ::~pair(in_stack_fffffffffffffef8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>::
  ~pair(&in_stack_fffffffffffffef8->first);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteDescriptorLastHardenedCache(const CExtPubKey& xpub, const uint256& desc_id, uint32_t key_exp_index)
{
    std::vector<unsigned char> ser_xpub(BIP32_EXTKEY_SIZE);
    xpub.Encode(ser_xpub.data());
    return WriteIC(std::make_pair(std::make_pair(DBKeys::WALLETDESCRIPTORLHCACHE, desc_id), key_exp_index), ser_xpub);
}